

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
* __thiscall BoardView::SearchPartsAndNets(BoardView *this,char *search,int limit)

{
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *in_RDX;
  char *in_RSI;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  *in_RDI;
  SharedVector<Net> nets;
  SharedVector<Component> parts;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_fffffffffffffee8;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *__x;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_fffffffffffffef0;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_fffffffffffffef8;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string local_d8 [4];
  int in_stack_ffffffffffffff2c;
  string *in_stack_ffffffffffffff30;
  Searcher *in_stack_ffffffffffffff38;
  undefined1 local_89 [113];
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
            ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             0x1233bd);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::vector
            ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)0x1233ca);
  if ((in_RSI[0xd6aa] & 1U) != 0) {
    in_stack_fffffffffffffef0 =
         (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
         (in_RSI + 0xc978);
    in_stack_ffffffffffffff00 =
         (pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
          *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_RSI,(allocator<char> *)in_RDI);
    Searcher::parts(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::operator=
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              (in_stack_fffffffffffffef0);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    in_stack_fffffffffffffef8 = local_18;
  }
  if ((in_RSI[0xd6ab] & 1U) != 0) {
    __x = (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
          &stack0xffffffffffffff27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_RSI,(allocator<char> *)in_RDI);
    Searcher::nets(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::operator=
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
               in_stack_fffffffffffffef0,__x);
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
               in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
  }
  std::
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  ::
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_&,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_&,_true>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             in_stack_fffffffffffffef0);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
            ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             in_stack_fffffffffffffef0);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

std::pair<SharedVector<Component>, SharedVector<Net>> BoardView::SearchPartsAndNets(const char *search, int limit) {
	SharedVector<Component> parts;
	SharedVector<Net> nets;
	if (m_searchComponents) parts = searcher.parts(search, limit);
	if (m_searchNets) nets = searcher.nets(search, limit);
	return {parts, nets};
}